

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O1

void __thiscall ByteCodeGenerator::CheckDeferParseHasMaybeEscapedNestedFunc(ByteCodeGenerator *this)

{
  SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *pSVar1;
  ParseableFunctionInfo *this_00;
  FunctionBody *pFVar2;
  code *pcVar3;
  bool bVar4;
  uint sourceContextId;
  int iVar5;
  undefined4 *puVar6;
  Type *ppFVar7;
  FuncInfo *pFVar8;
  FunctionBody *pFVar9;
  undefined4 extraout_var;
  char16 *pcVar10;
  Scope *this_01;
  wchar local_a8 [4];
  char16 debugStringBuffer [42];
  undefined1 local_40 [8];
  Iterator i;
  
  if (this->parentScopeInfo != (ScopeInfo *)0x0) {
    pSVar1 = this->funcInfoStack;
    if ((pSVar1 == (SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)0x0) ||
       ((SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)
        (pSVar1->super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>).
        super_SListNodeBase<Memory::ArenaAllocator>.next == pSVar1)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0x82f,"(this->funcInfoStack && !this->funcInfoStack->Empty())",
                         "this->funcInfoStack && !this->funcInfoStack->Empty()");
      if (!bVar4) goto LAB_00834945;
      *puVar6 = 0;
    }
    local_40 = (undefined1  [8])this->funcInfoStack;
    i.list = (SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)local_40;
    if (local_40 == (undefined1  [8])0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar4) goto LAB_00834945;
      *puVar6 = 0;
    }
    pSVar1 = (SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)
             ((i.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
    i.list = (SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
    if ((undefined1  [8])pSVar1 == local_40) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0x834,"(succeed)","succeed");
      if (!bVar4) goto LAB_00834945;
      *puVar6 = 0;
      pSVar1 = (SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)i.list;
    }
    i.list = &pSVar1->super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>;
    ppFVar7 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                        ((Iterator *)local_40);
    bVar4 = FuncInfo::IsGlobalFunction(*ppFVar7);
    if (!bVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0x835,"(i.Data()->IsGlobalFunction())","i.Data()->IsGlobalFunction()");
      if (!bVar4) goto LAB_00834945;
      *puVar6 = 0;
    }
    ppFVar7 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                        ((Iterator *)local_40);
    if ((*ppFVar7)->root == (ParseNodeFnc *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0x836,"(!i.Data()->IsRestored())","!i.Data()->IsRestored()");
      if (!bVar4) goto LAB_00834945;
      *puVar6 = 0;
    }
    if (i.list == (SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar4) goto LAB_00834945;
      *puVar6 = 0;
    }
    pSVar1 = (SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)
             ((i.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
    i.list = &((SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)0x0)->
              super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>;
    if ((undefined1  [8])pSVar1 != local_40) {
      i.list = (SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)pSVar1;
    }
    ppFVar7 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                        ((Iterator *)local_40);
    pFVar8 = *ppFVar7;
    bVar4 = FuncInfo::IsGlobalFunction(pFVar8);
    if (bVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0x83a,"(!top->IsGlobalFunction())","!top->IsGlobalFunction()");
      if (!bVar4) goto LAB_00834945;
      *puVar6 = 0;
    }
    if (pFVar8->root != (ParseNodeFnc *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0x83b,"(top->IsRestored())","top->IsRestored()");
      if (!bVar4) goto LAB_00834945;
      *puVar6 = 0;
    }
    pFVar9 = (FunctionBody *)this->pRootFunc;
    bVar4 = Js::FunctionProxy::IsFunctionBody((FunctionProxy *)pFVar9);
    if (!bVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                         ,0x59e,"(IsFunctionBody())","IsFunctionBody()");
      if (!bVar4) goto LAB_00834945;
      *puVar6 = 0;
    }
    if (((pFVar9->super_ParseableFunctionInfo).flags & Flags_StackNestedFunc) == Flags_None) {
      FuncInfo::SetHasMaybeEscapedNestedFunc(pFVar8,L"DeferredChild");
    }
    else {
      this_01 = pFVar8->paramScope;
      if ((this_01 == (Scope *)0x0) && (this_01 = pFVar8->bodyScope, this_01 == (Scope *)0x0)) {
        this_01 = pFVar8->funcExprScope;
      }
      pFVar8 = Scope::GetEnclosingFunc(this_01);
      bVar4 = FuncInfo::IsGlobalFunction(pFVar8);
      if (!bVar4) {
        if ((FunctionBody *)pFVar8->byteCodeFunction == pFVar9) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar6 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                             ,0x84a,"(parentFunc->byteCodeFunction != rootFuncBody)",
                             "parentFunc->byteCodeFunction != rootFuncBody");
          if (!bVar4) {
LAB_00834945:
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          *puVar6 = 0;
        }
        if ((pFVar8->byteCodeFunction->flags & Flags_StackNestedFunc) != Flags_None) {
          Js::FunctionBody::SetStackNestedFuncParent
                    (pFVar9,(pFVar8->byteCodeFunction->super_FunctionProxy).functionInfo.ptr);
        }
      }
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    stack0xffffffffffffffb0 = (Phases *)&DAT_015d3490;
    do {
      ppFVar7 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                          ((Iterator *)local_40);
      pFVar8 = *ppFVar7;
      if (pFVar8->root != (ParseNodeFnc *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                           ,0x856,"(funcInfo->IsRestored())","funcInfo->IsRestored()");
        if (!bVar4) goto LAB_00834945;
        *puVar6 = 0;
      }
      this_00 = pFVar8->byteCodeFunction;
      if (this_00 == (ParseableFunctionInfo *)0x0) {
        if ((pFVar8->bodyScope != (Scope *)0x0) &&
           (iVar5 = 1, pFVar8->bodyScope->scopeType == ScopeType_Global)) goto LAB_0083489d;
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                           ,0x85a,
                           "(funcInfo->GetBodyScope() && funcInfo->GetBodyScope()->GetScopeType() == ScopeType_Global)"
                           ,
                           "funcInfo->GetBodyScope() && funcInfo->GetBodyScope()->GetScopeType() == ScopeType_Global"
                          );
        if (!bVar4) goto LAB_00834945;
        *puVar6 = 0;
LAB_00834898:
        iVar5 = 1;
      }
      else {
        if ((this_00->flags & Flags_StackNestedFunc) == Flags_None) goto LAB_00834898;
        bVar4 = Js::FunctionProxy::IsFunctionBody(&this_00->super_FunctionProxy);
        iVar5 = 0x11;
        if (bVar4) {
          pFVar9 = FuncInfo::GetParsedFunctionBody(pFVar8);
          iVar5 = 0;
          if ((pFVar8->field_0xb5 & 0x20) != 0) {
            sourceContextId =
                 Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this->pCurrentFunction);
            pFVar2 = this->pCurrentFunction;
            if ((pFVar2->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
                (FunctionInfo *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar6 = 1;
              bVar4 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                 ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
              if (!bVar4) goto LAB_00834945;
              *puVar6 = 0;
            }
            bVar4 = Js::Phases::IsEnabled
                              (stack0xffffffffffffffb0,StackFuncPhase,sourceContextId,
                               ((pFVar2->super_ParseableFunctionInfo).super_FunctionProxy.
                                functionInfo.ptr)->functionId);
            if (bVar4) {
              iVar5 = (*(pFVar9->super_ParseableFunctionInfo).super_FunctionProxy.
                        super_FinalizableObject.super_IRecyclerVisitedObject.
                        _vptr_IRecyclerVisitedObject[7])(pFVar9);
              pcVar10 = Js::FunctionProxy::GetDebugNumberSet
                                  ((FunctionProxy *)pFVar9,(wchar (*) [42])local_a8);
              Output::Print(L"DeferParse: box and disable stack function: %s (function %s)\n",
                            CONCAT44(extraout_var,iVar5),pcVar10);
              Output::Flush();
            }
            Js::StackScriptFunction::Box(pFVar9,this->functionRef);
            goto LAB_00834898;
          }
        }
      }
LAB_0083489d:
      if ((iVar5 != 0x11) && (iVar5 != 0)) {
        return;
      }
      if (i.list == (SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar4) goto LAB_00834945;
        *puVar6 = 0;
      }
      i.list = (SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)
               ((i.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
    } while ((undefined1  [8])i.list != local_40);
  }
  return;
}

Assistant:

void ByteCodeGenerator::CheckDeferParseHasMaybeEscapedNestedFunc()
{
    if (!this->parentScopeInfo)
    {
        return;
    }

    Assert(this->funcInfoStack && !this->funcInfoStack->Empty());

    // Box the stack nested function if we detected new may be escaped use function.
    SList<FuncInfo *>::Iterator i(this->funcInfoStack);
    bool succeed = i.Next();
    Assert(succeed);
    Assert(i.Data()->IsGlobalFunction()); // We always leave a glo on type when defer parsing.
    Assert(!i.Data()->IsRestored());
    succeed = i.Next();
    FuncInfo * top = i.Data();

    Assert(!top->IsGlobalFunction());
    Assert(top->IsRestored());
    Js::FunctionBody * rootFuncBody = this->GetRootFunc()->GetFunctionBody();
    if (!rootFuncBody->DoStackNestedFunc())
    {
        top->SetHasMaybeEscapedNestedFunc(DebugOnly(_u("DeferredChild")));
    }
    else
    {
        // We have to wait until it is parsed before we populate the stack nested func parent.
        Scope * enclosingScope = top->GetParamScope() ? top->GetParamScope() :
                                 top->GetBodyScope() ? top->GetBodyScope() :
                                 top->GetFuncExprScope();
        FuncInfo * parentFunc = enclosingScope->GetEnclosingFunc();
        if (!parentFunc->IsGlobalFunction())
        {
            Assert(parentFunc->byteCodeFunction != rootFuncBody);
            Js::ParseableFunctionInfo * parentFunctionInfo = parentFunc->byteCodeFunction;
            if (parentFunctionInfo->DoStackNestedFunc())
            {
                rootFuncBody->SetStackNestedFuncParent(parentFunctionInfo->GetFunctionInfo());
            }
        }
    }

    do
    {
        FuncInfo * funcInfo = i.Data();
        Assert(funcInfo->IsRestored());
        Js::ParseableFunctionInfo * parseableFunctionInfo = funcInfo->byteCodeFunction;
        if (parseableFunctionInfo == nullptr)
        {
            Assert(funcInfo->GetBodyScope() && funcInfo->GetBodyScope()->GetScopeType() == ScopeType_Global);
            return;
        }
        bool didStackNestedFunc = parseableFunctionInfo->DoStackNestedFunc();
        if (!didStackNestedFunc)
        {
            return;
        }
        if (!parseableFunctionInfo->IsFunctionBody())
        {
            continue;
        }
        Js::FunctionBody * functionBody = funcInfo->GetParsedFunctionBody();
        if (funcInfo->HasMaybeEscapedNestedFunc())
        {
            // This should box the rest of the parent functions.
            if (PHASE_TESTTRACE(Js::StackFuncPhase, this->pCurrentFunction))
            {
                char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];

                Output::Print(_u("DeferParse: box and disable stack function: %s (function %s)\n"),
                    functionBody->GetDisplayName(), functionBody->GetDebugNumberSet(debugStringBuffer));
                Output::Flush();
            }

            // During the box workflow we reset all the parents of all nested functions and up. If a fault occurs when the stack function
            // is created this will cause further issues when trying to use the function object again. So failing faster seems to make more sense.
            try
            {
                Js::StackScriptFunction::Box(functionBody, functionRef);
            }
            catch (Js::OutOfMemoryException)
            {
                FailedToBox_OOM_unrecoverable_error((ULONG_PTR)functionBody);
            }

            return;
        }
    }
    while (i.Next());
}